

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::Scope::lookupName
          (Scope *this,string_view name,LookupLocation location,
          bitmask<slang::ast::LookupFlags> flags)

{
  Symbol *pSVar1;
  NameSyntax *syntax;
  ASTContext local_280;
  LookupResult result;
  
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  result.found = (Symbol *)0x0;
  result.systemSubroutine._0_5_ = 0;
  result.systemSubroutine._5_3_ = 0;
  result.upwardCount = 0;
  result.flags.m_bits = '\0';
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_280.lookupIndex = location.index;
  local_280.flags.m_bits = 0;
  local_280.instanceOrProc = (Symbol *)0x0;
  local_280.firstTempVar = (TempVarSymbol *)0x0;
  local_280.randomizeDetails = (RandomizeDetails *)0x0;
  local_280.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_280.scope.ptr = this;
  syntax = Compilation::parseName(this->compilation,name);
  Lookup::name(syntax,&local_280,flags,&result);
  pSVar1 = result.found;
  LookupResult::~LookupResult(&result);
  return pSVar1;
}

Assistant:

const Symbol* Scope::lookupName(std::string_view name, LookupLocation location,
                                bitmask<LookupFlags> flags) const {
    LookupResult result;
    ASTContext context(*this, location);
    Lookup::name(compilation.parseName(name), context, flags, result);
    SLANG_ASSERT(result.selectors.empty());
    return result.found;
}